

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O1

char * eread(char *fmt,char *buf,size_t nbuf,int flag,...)

{
  byte bVar1;
  char *__s2;
  bool bVar2;
  anon_union_8_3_aeaae240_for_l_p *paVar3;
  char in_AL;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  buffer *pbVar8;
  list *plVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 *__ptr;
  size_t sVar12;
  line *plVar13;
  mgwin *pmVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  char *pcVar20;
  list *plVar21;
  int iVar22;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar23;
  long lVar24;
  buffer *pbVar25;
  uint uVar26;
  bool bVar27;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_198 [32];
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined1 local_e8 [8];
  va_list ap;
  long local_a8;
  ulong local_a0;
  ulong local_70;
  ulong local_60;
  int local_54;
  char *local_50;
  uint local_44;
  size_t local_40;
  size_t local_38;
  
  ap[0].overflow_arg_area = local_198;
  if (in_AL != '\0') {
    local_168 = in_XMM0_Qa;
    local_158 = in_XMM1_Qa;
    local_148 = in_XMM2_Qa;
    local_138 = in_XMM3_Qa;
    local_128 = in_XMM4_Qa;
    local_118 = in_XMM5_Qa;
    local_108 = in_XMM6_Qa;
    local_f8 = in_XMM7_Qa;
  }
  ap[0]._0_8_ = &stack0x00000008;
  local_e8._0_4_ = 0x20;
  local_e8._4_4_ = 0x30;
  local_178 = in_R8;
  local_170 = in_R9;
  if (inmacro == 0) {
    if (((flag & 8U) == 0) && (ttrow == nrow + -1)) {
      eputc(' ');
    }
    else {
      ttcolor(1);
      ttmove(nrow + -1,0);
      epresf = 1;
    }
    eformat(fmt,(__va_list_tag *)local_e8);
    local_40 = 0;
    if ((flag & 0x20U) != 0) {
      if (buf == (char *)0x0) {
        return (char *)0x0;
      }
      cVar4 = *buf;
      if (cVar4 != '\0') {
        pcVar20 = buf + 1;
        do {
          eputc(cVar4);
          cVar4 = *pcVar20;
          pcVar20 = pcVar20 + 1;
        } while (cVar4 != '\0');
      }
      local_40 = strlen(buf);
    }
    tteeol();
    ttflush();
    bVar2 = true;
    bVar27 = false;
    local_a8 = 0;
    local_a0 = 0;
    local_54 = 0;
    local_70 = nbuf;
    local_50 = buf;
    local_38 = local_40;
LAB_0010c3a0:
    do {
      iVar5 = getkey(0);
      if ((flag & 7U) == 0 || iVar5 != 9) {
        iVar18 = (int)local_40;
        while (0 < local_54) {
          bVar27 = false;
          if ((int)local_a0 == local_54) {
            lVar24 = *(long *)(*(long *)(_cur_term + 0x20) + 0x278);
            uVar23 = local_a0 & 0xffffffff;
            cVar4 = *(char *)(lVar24 + uVar23);
            if (iVar5 == cVar4 && cVar4 != '\0') {
              bVar27 = *(char *)(lVar24 + 1 + uVar23) == '\0';
              if (bVar27) {
                local_54 = 0;
              }
              local_a0 = uVar23 + 1;
              if (bVar27) {
                iVar5 = 2;
              }
              bVar27 = true;
            }
          }
          if ((int)local_a8 == local_54) {
            lVar24 = *(long *)(*(long *)(_cur_term + 0x20) + 0x298);
            lVar16 = (long)(int)local_a8;
            iVar22 = (int)*(char *)(lVar24 + lVar16);
            if ((iVar22 != 0) && (iVar5 == iVar22)) {
              bVar27 = *(char *)(lVar24 + 1 + lVar16) == '\0';
              if (bVar27) {
                local_54 = 0;
              }
              local_a8 = lVar16 + 1;
              if (bVar27) {
                iVar5 = 6;
              }
              bVar27 = true;
            }
          }
          if (bVar27) {
            if (local_54 < 1) break;
            local_54 = local_54 + 1;
          }
          else {
            local_54 = 0;
          }
LAB_0010c4fb:
          bVar27 = false;
          iVar5 = getkey(0);
          if ((flag & 7U) != 0 && iVar5 == 9) goto LAB_0010cdbe;
        }
        uVar15 = (uint)local_38;
        uVar26 = (uint)local_40;
        switch(iVar5) {
        case 1:
          if (0 < (int)uVar15) {
            lVar24 = (local_38 & 0xffffffff) + 1;
            do {
              if ((cinfo[(byte)local_50[lVar24 + -2]] & 8U) != 0) {
                ttputc(8);
                ttcol = ttcol + -1;
              }
              ttputc(8);
              ttcol = ttcol + -1;
              lVar24 = lVar24 + -1;
            } while (1 < lVar24);
            local_38 = 0;
          }
          goto LAB_0010cda6;
        case 2:
          if ((int)uVar15 < 1) break;
          local_38 = (size_t)(uVar15 - 1);
          if ((cinfo[(byte)local_50[local_38]] & 8U) != 0) {
            ttputc(8);
            ttcol = ttcol + -1;
          }
          ttputc(8);
          ttcol = ttcol + -1;
          goto LAB_0010cda6;
        case 3:
        case 9:
        case 0xc:
        case 0xe:
        case 0xf:
        case 0x10:
        case 0x12:
        case 0x13:
        case 0x14:
        case 0x16:
        case 0x1a:
          goto switchD_0010c4be_caseD_3;
        case 4:
          bVar27 = (uint)local_40 != uVar15;
          if (bVar27) {
            tteeol();
            iVar18 = ttcol;
            iVar5 = ttrow;
            sVar12 = local_38;
            while (local_44 = uVar15, (int)uVar15 < (int)(uVar26 - 1)) {
              local_50[(int)sVar12] = local_50[(long)(int)sVar12 + 1];
              eputc(local_50[(int)uVar15]);
              uVar15 = uVar15 + 1;
              sVar12 = (size_t)uVar15;
            }
            local_40 = (ulong)(uVar26 - 1);
            ttmove(iVar5,iVar18);
            ttflush();
          }
          break;
        case 5:
          iVar5 = (uint)local_40 - uVar15;
          if ((int)uVar15 < (int)(uint)local_40) {
            lVar24 = 0;
            do {
              eputc(local_50[lVar24 + (int)uVar15]);
              lVar24 = lVar24 + 1;
            } while (iVar5 != (int)lVar24);
            local_38 = local_40;
          }
          goto LAB_0010cda6;
        case 6:
          bVar27 = (int)(uint)local_40 <= (int)uVar15;
          if (bVar27) break;
          local_38 = (size_t)(uVar15 + 1);
          eputc(local_50[(int)uVar15]);
          goto LAB_0010cda6;
        case 7:
          eputc('\a');
          local_50 = (char *)0x0;
          ctrlg(8,0);
          ttflush();
          goto LAB_0010d390;
        case 8:
switchD_0010c4be_caseD_8:
          if (uVar15 != 0) {
            bVar1 = local_50[(long)(int)uVar15 + -1];
            ttputc(8);
            ttcol = ttcol + -1;
            if ((cinfo[bVar1] & 8U) != 0) {
              ttputc(8);
              ttcol = ttcol + -1;
            }
            iVar18 = ttcol;
            iVar5 = ttrow;
            uVar23 = (long)(int)uVar15 - 1;
            uVar15 = (int)local_40 - 1;
            local_44 = (uint)uVar23;
            if ((int)(uint)local_38 < (int)local_40) {
              uVar11 = uVar23 & 0xffffffff;
              do {
                uVar26 = local_44;
                local_50[(int)uVar11] = local_50[(long)(int)uVar11 + 1];
                eputc(local_50[(int)local_44]);
                local_44 = uVar26 + 1;
                uVar11 = (ulong)local_44;
              } while ((int)local_44 < (int)uVar15);
            }
            ttputc(0x20);
            if ((cinfo[bVar1] & 8U) != 0) {
              ttputc(0x20);
              ttputc(8);
            }
            ttputc(8);
            ttmove(iVar5,iVar18);
            ttflush();
            local_40 = (ulong)uVar15;
            local_38 = uVar23;
            break;
          }
          goto LAB_0010c7d3;
        case 10:
        case 0xd:
          if (iVar18 == 0 && (flag & 0x40U) == 0) {
            ctrlg(8,0);
            ttflush();
            return (char *)0x0;
          }
          uVar15 = (uint)local_40;
          if ((flag & 1U) != 0) {
            iVar5 = complt(flag,0xd,local_50,local_70,(uint)local_40,(int *)&local_44);
            if (iVar5 == 0) goto LAB_0010c4fb;
            uVar15 = 0;
            if (0 < (int)local_44) {
              uVar15 = local_44;
            }
            uVar15 = uVar15 + (uint)local_40;
          }
          sVar12 = local_38;
          local_50[(int)uVar15] = '\0';
          if ((flag & 0x10U) != 0) {
            ttputc(0xd);
            ttflush();
          }
          if (macrodef != 0) {
            plVar13 = lalloc((int)sVar12);
            if (plVar13 == (line *)0x0) {
              iVar5 = 0xe;
            }
            else {
              plVar13->l_fp = maclcur->l_fp;
              maclcur->l_fp = plVar13;
              plVar13->l_bp = maclcur;
              maclcur = plVar13;
              memmove(plVar13->l_text,local_50,(long)(int)sVar12);
              iVar5 = 0;
            }
            if (iVar5 != 0) {
              if (iVar5 != 0xe) {
                return local_50;
              }
              goto LAB_0010d35a;
            }
          }
LAB_0010d390:
          if (bVar2) {
            return local_50;
          }
          pbVar8 = bfind("*Completions*",1);
          pmVar14 = popbuf(pbVar8,1);
          if (pmVar14 != (mgwin *)0x0) {
            if ((pmVar14->w_flag & 1U) != 0) {
              curwp = pmVar14;
              delwind(8,1);
              return local_50;
            }
            killbuffer(pbVar8);
            return local_50;
          }
          return local_50;
        case 0xb:
          kdelete();
          local_44 = (uint)local_38;
          uVar15 = (uint)local_40;
          if ((int)local_44 < (int)uVar15) {
            pcVar20 = local_50 + (int)local_44;
            do {
              uVar26 = local_44 + 1;
              kinsert((int)*pcVar20,1);
              pcVar20 = pcVar20 + 1;
              local_44 = uVar26;
            } while (uVar26 != uVar15);
          }
          tteeol();
          ttflush();
          local_40 = local_38;
          break;
        case 0x11:
        case 0x1c:
          iVar5 = getkey(0);
          goto switchD_0010c4be_caseD_3;
        case 0x15:
        case 0x18:
          if (uVar15 != 0) {
            lVar24 = (long)(int)uVar15;
            do {
              ttputc(8);
              ttputc(0x20);
              ttputc(8);
              ttcol = ttcol + -1;
              if ((cinfo[(byte)local_50[lVar24 + -1]] & 8U) != 0) {
                ttputc(8);
                ttputc(0x20);
                ttputc(8);
                ttcol = ttcol + -1;
              }
              lVar24 = lVar24 + -1;
            } while (lVar24 != 0);
            local_40 = (size_t)((int)local_40 - (uint)local_38);
          }
          ttflush();
LAB_0010c7d3:
          local_38 = 0;
          break;
        case 0x17:
          sVar12 = local_38;
          if ((int)uVar15 < 1) goto LAB_0010cce2;
          uVar26 = (uint)local_40 - uVar15;
          uVar23 = local_38 & 0xffffffff;
          goto LAB_0010cb69;
        case 0x19:
          local_44 = 0;
          goto LAB_0010c80e;
        case 0x1b:
          local_a8 = 1;
          local_a0 = 1;
          local_54 = 1;
          break;
        default:
          if (iVar5 == 0x7f) goto switchD_0010c4be_caseD_8;
switchD_0010c4be_caseD_3:
          if ((buf == (char *)0x0) && (local_70 <= (ulong)(long)((int)local_40 + 1))) {
            sVar12 = (size_t)((int)local_40 * 2 + 0x10);
            pcVar20 = (char *)realloc(local_50,sVar12);
            if (pcVar20 != (char *)0x0) {
              local_50 = pcVar20;
              local_70 = sVar12;
            }
            iVar18 = (int)local_38;
            if (pcVar20 == (char *)0x0) goto LAB_0010d35a;
          }
          else {
            iVar18 = (int)local_38;
          }
          uVar15 = (uint)local_40;
          sVar12 = local_40;
          if ((buf == (char *)0x0) || ((ulong)(long)(int)(uVar15 + 1) < local_70)) {
            while (local_44 = uVar15, iVar18 < (int)local_44) {
              local_50[(int)sVar12] = local_50[(long)(int)sVar12 + -1];
              sVar12 = (ulong)(local_44 - 1);
              uVar15 = local_44 - 1;
            }
            uVar15 = iVar18 + 1;
            local_50[iVar18] = (char)iVar5;
            eputc((char)iVar5);
            iVar5 = ttrow;
            local_38 = CONCAT44(local_38._4_4_,ttcol);
            iVar22 = (uint)local_40;
            local_44 = uVar15;
            if (iVar18 < (int)(uint)local_40) {
              pcVar20 = local_50 + iVar18;
              uVar26 = iVar18 + 2;
              do {
                uVar19 = uVar26;
                pcVar20 = pcVar20 + 1;
                eputc(*pcVar20);
                uVar26 = uVar19 + 1;
                local_44 = uVar19;
              } while (uVar19 - iVar22 != 1);
            }
            local_40 = (size_t)((int)local_40 + 1);
            ttmove(iVar5,(uint)local_38);
            ttflush();
            local_38 = (size_t)uVar15;
          }
          else {
            dobeep();
            ewprintf("Line too long. Press Control-g to escape.");
          }
        }
        goto LAB_0010cdab;
      }
LAB_0010cdbe:
      sVar12 = local_40;
      iVar22 = tthue;
      iVar18 = ttcol;
      iVar5 = ttrow;
      if (!bVar27) {
        iVar18 = (int)local_40;
        iVar5 = complt(flag,9,local_50,local_70,iVar18,(int *)&local_44);
        uVar15 = local_44 + iVar18;
        bVar27 = iVar5 != 0;
        local_40 = sVar12 & 0xffffffff;
        if (bVar27) {
          local_40 = (size_t)uVar15;
        }
        if (!bVar27) {
          uVar15 = (uint)local_38;
        }
        local_38 = (ulong)uVar15;
        goto LAB_0010c3a0;
      }
      ttflush();
      bVar27 = true;
      pbVar8 = bfind("*Completions*",1);
      iVar6 = bclear(pbVar8);
      sVar12 = local_38;
      bVar2 = false;
      if (iVar6 != 0) {
        pbVar8->b_flag = pbVar8->b_flag | 0x10;
        if ((flag & 2U) != 0) {
          iVar6 = 0;
          if (bheadp == (buffer *)0x0) {
            plVar9 = (list *)0x0;
            goto LAB_0010cf8f;
          }
          plVar21 = (list *)0x0;
          pbVar25 = bheadp;
          do {
            plVar9 = (list *)malloc(0x10);
            if (plVar9 == (list *)0x0) goto joined_r0x0010cf20;
            (plVar9->l_p).l_nxt = plVar21;
            pcVar20 = strdup((pbVar25->b_list).l_name);
            plVar9->l_name = pcVar20;
            pbVar25 = (buffer *)(pbVar25->b_list).l_p.l_wp;
            plVar21 = plVar9;
          } while (pbVar25 != (buffer *)0x0);
          goto LAB_0010cf48;
        }
        if ((flag & 1U) == 0) {
          if ((flag & 4U) == 0) {
            panic("broken complt call: flags");
          }
          local_50[(int)local_38] = '\0';
          plVar9 = make_file_list(local_50);
          pcVar20 = strrchr(local_50,0x2f);
          if (pcVar20 == (char *)0x0) {
            iVar6 = 0;
          }
          else {
            iVar6 = ((int)pcVar20 - (int)local_50) + 1;
          }
        }
        else {
          local_50[(int)local_38] = '\0';
          plVar9 = complete_function_list(local_50);
          iVar6 = 0;
        }
        goto LAB_0010cf8f;
      }
    } while( true );
  }
  if (buf == (char *)0x0) {
    buf = (char *)malloc((long)maclcur->l_used + 1);
    if (buf != (char *)0x0) goto LAB_0010d242;
  }
  else if ((ulong)(long)maclcur->l_used < nbuf) {
LAB_0010d242:
    memmove(buf,maclcur->l_text,(long)maclcur->l_used);
    buf[maclcur->l_used] = '\0';
    maclcur = maclcur->l_fp;
    return buf;
  }
  return (char *)0x0;
LAB_0010c80e:
  do {
    uVar15 = local_44;
    local_44 = local_44 + 1;
    iVar5 = kremove(uVar15);
    if ((iVar5 < 0) || (iVar5 == *curbp->b_nlchr)) goto LAB_0010cda6;
    sVar12 = local_70;
    pcVar20 = local_50;
    if ((buf == (char *)0x0) && (local_70 <= (ulong)(long)((int)local_40 + 1))) {
      sVar12 = (size_t)((int)local_40 * 2 + 0x10);
      pcVar20 = (char *)realloc(local_50,sVar12);
      if (pcVar20 != (char *)0x0) goto LAB_0010c89e;
      iVar5 = 0xe;
    }
    else {
LAB_0010c89e:
      local_50 = pcVar20;
      local_70 = sVar12;
      if ((buf == (char *)0x0) || ((ulong)(long)(int)((uint)local_40 + 1) < sVar12)) {
        lVar24 = (long)(int)local_38;
        if ((int)local_38 < (int)(uint)local_40) {
          lVar16 = (long)(int)(uint)local_40;
          do {
            pcVar20[lVar16] = pcVar20[lVar16 + -1];
            lVar16 = lVar16 + -1;
          } while (lVar24 < lVar16);
        }
        pcVar20[lVar24] = (char)iVar5;
        eputc((char)iVar5);
        iVar18 = ttcol;
        iVar5 = ttrow;
        iVar22 = (int)local_40 - (uint)local_38;
        if ((int)(uint)local_38 < (int)local_40) {
          lVar16 = 0;
          do {
            eputc(pcVar20[lVar16 + lVar24 + 1]);
            lVar16 = lVar16 + 1;
          } while (iVar22 != (int)lVar16);
        }
        local_38 = (size_t)((int)local_38 + 1);
        local_40 = (size_t)((int)local_40 + 1);
        ttmove(iVar5,iVar18);
        iVar5 = 0;
      }
      else {
        dobeep();
        ewprintf("Line too long. Press Control-g to escape.");
        iVar5 = 0xf;
      }
    }
  } while (iVar5 == 0);
  if (iVar5 == 0xe) {
LAB_0010d35a:
    if ((buf == (char *)0x0) && (local_50 != (char *)0x0)) {
      free(local_50);
    }
    dobeep();
    ewprintf("Out of memory");
    return &veread_emptyval;
  }
  if (iVar5 != 0xf) {
    return buf;
  }
  goto LAB_0010cdab;
  while( true ) {
    ttputc(8);
    ttputc(0x20);
    ttputc(8);
    ttcol = ttcol + -1;
    if ((cinfo[(byte)local_50[uVar23 - 1]] & 8U) != 0) {
      ttputc(8);
      ttputc(0x20);
      ttputc(8);
      ttcol = ttcol + -1;
    }
    local_40 = (size_t)((int)local_40 - 1);
    bVar27 = (long)uVar23 < 2;
    uVar23 = uVar23 - 1;
    if (bVar27) break;
LAB_0010cb69:
    if ((cinfo[(byte)local_50[uVar23 - 1]] & 1U) != 0) {
      uVar26 = (uint)local_40;
      sVar12 = uVar23 & 0xffffffff;
      goto LAB_0010cce2;
    }
  }
  sVar12 = 0;
LAB_0010cce2:
  if ((int)sVar12 < 1) {
    local_40 = (size_t)uVar26;
    local_38 = sVar12;
  }
  else {
    local_40 = (size_t)(uVar26 - (int)sVar12);
    uVar23 = sVar12 & 0xffffffff;
    do {
      if ((cinfo[(byte)local_50[uVar23 - 1]] & 1U) == 0) {
        local_40 = (size_t)uVar26;
        local_38 = uVar23;
        goto LAB_0010cda6;
      }
      ttputc(8);
      ttputc(0x20);
      ttputc(8);
      ttcol = ttcol + -1;
      if ((cinfo[(byte)local_50[uVar23 - 1]] & 8U) != 0) {
        ttputc(8);
        ttputc(0x20);
        ttputc(8);
        ttcol = ttcol + -1;
      }
      uVar26 = uVar26 - 1;
      bVar27 = 1 < (long)uVar23;
      uVar23 = uVar23 - 1;
    } while (bVar27);
    local_38 = 0;
  }
LAB_0010cda6:
  ttflush();
LAB_0010cdab:
  bVar27 = false;
  goto LAB_0010c3a0;
joined_r0x0010cf20:
  while (plVar21 != (list *)0x0) {
    plVar9 = (plVar21->l_p).l_nxt;
    free(plVar21->l_name);
    free(plVar21);
    plVar21 = plVar9;
  }
  plVar9 = (list *)0x0;
LAB_0010cf48:
  iVar6 = 0;
  sVar12 = local_38;
LAB_0010cf8f:
  uVar23 = sVar12 & 0xffffffff;
  plVar21 = plVar9;
  if (plVar9 == (list *)0x0) {
    local_60._0_4_ = 0;
  }
  else {
    do {
      for (pmVar14 = (plVar21->l_p).l_wp; pmVar14 != (mgwin *)0x0;
          pmVar14 = (pmVar14->w_list).l_p.l_wp) {
        pcVar20 = plVar21->l_name;
        __s2 = (pmVar14->w_list).l_name;
        iVar7 = strcmp(pcVar20,__s2);
        if (0 < iVar7) {
          plVar21->l_name = __s2;
          (pmVar14->w_list).l_name = pcVar20;
        }
      }
      paVar3 = &plVar21->l_p;
      plVar21 = paVar3->l_nxt;
    } while (paVar3->l_nxt != (list *)0x0);
    local_60 = 0;
    plVar21 = plVar9;
    do {
      uVar11 = 0;
      if (0 < (int)(uint)local_38) {
        uVar10 = 0;
        do {
          uVar11 = uVar10;
          if (local_50[uVar10] != plVar21->l_name[uVar10]) break;
          uVar10 = uVar10 + 1;
          uVar11 = uVar23;
        } while (uVar23 != uVar10);
      }
      if ((int)uVar11 == (uint)local_38) {
        uVar11 = strlen(plVar21->l_name);
        if ((int)uVar11 < (int)local_60) {
          uVar11 = local_60;
        }
        local_60 = uVar11 & 0xffffffff;
      }
      plVar21 = (plVar21->l_p).l_nxt;
    } while (plVar21 != (list *)0x0);
  }
  iVar17 = ((int)local_60 - iVar6) + 1;
  iVar7 = ncol;
  if (ncol <= iVar17) {
    iVar7 = iVar17;
  }
  uVar15 = iVar7 + 1;
  __ptr = (undefined1 *)malloc((long)(int)uVar15);
  if (__ptr == (undefined1 *)0x0) {
    free_file_list(plVar9);
    bVar2 = false;
  }
  else {
    *__ptr = 0;
    sVar12 = local_38;
    if (plVar9 != (list *)0x0) {
      uVar26 = 0;
      plVar21 = plVar9;
      do {
        uVar11 = 0;
        if (0 < (int)sVar12) {
          uVar10 = 0;
          do {
            uVar11 = uVar10;
            if (local_50[uVar10] != plVar21->l_name[uVar10]) break;
            uVar10 = uVar10 + 1;
            uVar11 = uVar23;
          } while (uVar23 != uVar10);
        }
        if ((int)uVar11 == (int)sVar12) {
          if (ncol < (int)(iVar17 + uVar26)) {
            uVar26 = 0;
            addlinef(pbVar8,"%s",__ptr);
            *__ptr = 0;
          }
          uVar11 = strlcat(__ptr,plVar21->l_name + iVar6,(long)(int)uVar15);
          uVar26 = uVar26 + iVar17;
          sVar12 = local_38;
          if ((uVar26 < uVar15) && (uVar11 < (ulong)(long)(int)uVar26)) {
            sVar12 = strlen(plVar21->l_name + iVar6);
            memset(__ptr + uVar11,0x20,(long)iVar17 - sVar12);
            __ptr[(int)uVar26] = 0;
            sVar12 = local_38;
          }
        }
        plVar21 = (plVar21->l_p).l_nxt;
      } while (plVar21 != (list *)0x0);
      if (0 < (int)uVar26) {
        addlinef(pbVar8,"%s",__ptr);
      }
    }
    free(__ptr);
    free_file_list(plVar9);
    bVar27 = true;
    popbuftop(pbVar8,1);
    update(2);
    ttmove(iVar5,iVar18);
    ttcolor(iVar22);
    ttflush();
    bVar2 = false;
    local_38 = sVar12;
  }
  goto LAB_0010c3a0;
}

Assistant:

char *
eread(const char *fmt, char *buf, size_t nbuf, int flag, ...)
{
	va_list	 ap;
	char	*rep;

	va_start(ap, flag);
	rep = veread(fmt, buf, nbuf, flag, ap);
	va_end(ap);
	return (rep);
}